

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_appendCString_success_notEnoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcStack_80;
  char *pcStack_78;
  char *pcStack_70;
  char *pcStack_68;
  char *pcStack_60;
  char *local_58;
  undefined8 uStack_50;
  AString string;
  
  string.reallocator._0_4_ = 0x11e238;
  string.reallocator._4_4_ = 0;
  string.deallocator._0_4_ = 0x11e278;
  string.deallocator._4_4_ = 0;
  string.buffer = (char *)0x0;
  string.size = 5;
  string.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12b5eb;
  string.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(string.buffer,"01234",6);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_50 = 0x12b62b;
  bVar1 = AString_appendCString(&string,"5678",4);
  if (bVar1 == false) {
    uStack_50 = 0x12b725;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3d5,"Assertion \'AString_appendCString(&string, \"5678\", 4)\' failed",0,0)
    ;
  }
  uStack_50 = 0x12b644;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x3d5);
  if (string.capacity == 0x10) {
    uStack_50 = 0x12b664;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x3d6);
    if (string.buffer == (char *)0x0) {
      local_58 = (char *)0x0;
      uStack_50 = 0;
      pcStack_60 = (char *)0x12b799;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x3d6,"Assertion \'_ck_x != NULL\' failed",
                        "Assertion \'%s\' failed: %s == %#x","(void*) (string).buffer != NULL",
                        "(void*) (string).buffer");
    }
    uStack_50 = 0x12b681;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x3d6);
    pcVar4 = string.buffer;
    if (string.buffer == (char *)0x0) {
      pcVar8 = "";
      pcVar4 = "(null)";
    }
    else {
      uStack_50 = 0x12b69e;
      iVar2 = strcmp("012345678",string.buffer);
      if (iVar2 == 0) {
        uStack_50 = 0x12b6b7;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x3d6);
        if (string.size == 9) {
          uStack_50 = 0x12b6d7;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x3d6);
          if (private_ACUtilsTest_AString_reallocCount == 1) {
            uStack_50 = 0x12b6f9;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x3d7);
            uStack_50 = 0x12b702;
            (*(code *)CONCAT44(string.deallocator._4_4_,string.deallocator._0_4_))(string.buffer);
            return;
          }
          pcStack_60 = "(1)";
          pcVar6 = "private_ACUtilsTest_AString_reallocCount == (1)";
          pcVar7 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x3d7;
          local_58 = (char *)0x1;
          pcVar8 = (char *)private_ACUtilsTest_AString_reallocCount;
        }
        else {
          pcStack_60 = "strlen(\"012345678\")";
          pcVar6 = "(string).size == strlen(\"012345678\")";
          pcVar7 = "(string).size";
          iVar2 = 0x3d6;
          local_58 = (char *)0x9;
          pcVar8 = (char *)string.size;
        }
        goto LAB_0012b86a;
      }
      pcVar8 = "\"";
    }
    expr = 
    "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
    ;
    pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
    pcVar6 = "(string).buffer == (\"012345678\")";
    pcVar7 = "(string).buffer";
    iVar2 = 0x3d6;
    local_58 = "\"";
    pcStack_60 = "012345678";
    pcStack_68 = "\"";
    pcStack_70 = "(\"012345678\")";
    ppcVar5 = &pcStack_80;
    pcStack_80 = pcVar4;
    pcStack_78 = pcVar8;
  }
  else {
    pcStack_60 = "(16)";
    pcVar6 = "(string).capacity == (16)";
    pcVar7 = "(string).capacity";
    iVar2 = 0x3d6;
    local_58 = (char *)0x10;
    pcVar8 = (char *)string.capacity;
LAB_0012b86a:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar5 = &pcStack_60;
  }
  uStack_50 = 0;
  *(char **)((long)ppcVar5 + -8) = pcVar8;
  *(code **)((long)ppcVar5 + -0x10) = test_AString_appendCString_success_nullptrArray_fn;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar6,pcVar7);
}

Assistant:

END_TEST
START_TEST(test_AString_appendCString_success_notEnoughCapacity)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("01234", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_appendCString(&string, "5678", 4));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012345678", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(1);
    private_ACUtilsTest_AString_destructTestString(string);
}